

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void poolClear(STRING_POOL *pool)

{
  block *pbVar1;
  BLOCK *tem;
  BLOCK *p;
  STRING_POOL *pool_local;
  
  if (pool->freeBlocks == (BLOCK *)0x0) {
    pool->freeBlocks = pool->blocks;
  }
  else {
    tem = pool->blocks;
    while (tem != (BLOCK *)0x0) {
      pbVar1 = tem->next;
      tem->next = pool->freeBlocks;
      pool->freeBlocks = tem;
      tem = pbVar1;
    }
  }
  pool->blocks = (BLOCK *)0x0;
  pool->start = (XML_Char *)0x0;
  pool->ptr = (XML_Char *)0x0;
  pool->end = (XML_Char *)0x0;
  return;
}

Assistant:

static
void poolClear(STRING_POOL *pool)
{
  if (!pool->freeBlocks)
    pool->freeBlocks = pool->blocks;
  else {
    BLOCK *p = pool->blocks;
    while (p) {
      BLOCK *tem = p->next;
      p->next = pool->freeBlocks;
      pool->freeBlocks = p;
      p = tem;
    }
  }
  pool->blocks = 0;
  pool->start = 0;
  pool->ptr = 0;
  pool->end = 0;
}